

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall ddd::DaTrie<false,_true,_true>::~DaTrie(DaTrie<false,_true,_true> *this)

{
  pointer pNVar1;
  pointer pBVar2;
  pointer pcVar3;
  pointer pBVar4;
  
  pNVar1 = (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pNVar1 != (pointer)0x0) {
    operator_delete(pNVar1);
  }
  pBVar2 = (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar2 != (pointer)0x0) {
    operator_delete(pBVar2);
  }
  pcVar3 = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar3 != (pointer)0x0) {
    operator_delete(pcVar3);
  }
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar4 != (pointer)0x0) {
    operator_delete(pBVar4);
    return;
  }
  return;
}

Assistant:

~DaTrie() {}